

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::PathTypeHandlerBase::SetPropertyInternal<false>
          (PathTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,
          PropertyIndex index,Var value,ObjectSlotAttributes attr,PropertyValueInfo *info,
          PropertyOperationFlags flags,SideEffects possibleSideEffects,bool isInit)

{
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  undefined4 extraout_var;
  PathTypeHandlerBase *this_00;
  DynamicTypeHandler *pDVar7;
  undefined7 in_register_00000089;
  uint32 local_58;
  undefined4 local_54;
  uint32 indexVal;
  PropertyValueInfo *local_48;
  PathTypeHandlerBase *local_40;
  char local_32;
  SideEffects local_31;
  ObjectSlotAttributes *instanceAttributes;
  
  local_54 = (undefined4)CONCAT71(in_register_00000089,attr);
  local_32 = isInit;
  local_31 = possibleSideEffects;
  _indexVal = (ulong)flags;
  local_40 = this;
  if (0xf < (uint)propertyId && value == (Var)0x0) {
    local_48 = info;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x31d,"(value != nullptr || IsInternalPropertyId(propertyId))",
                                "value != nullptr || IsInternalPropertyId(propertyId)");
    if (!bVar3) goto LAB_00c50604;
    *puVar6 = 0;
    info = local_48;
  }
  JavascriptLibrary::CheckAndInvalidateIsConcatSpreadableCache
            (propertyId,
             (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr);
  pTVar1 = (instance->super_RecyclableObject).type.ptr;
  if (index == 0xffff) {
    BVar5 = ScriptContext::IsNumericPropertyId
                      ((((pTVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                       scriptContext.ptr,propertyId,&local_58);
    if (BVar5 == 0) {
      BVar5 = AddPropertyInternal(local_40,instance,propertyId,value,(ObjectSlotAttributes)local_54,
                                  info,(PropertyOperationFlags)_indexVal,local_31);
      return BVar5;
    }
    BVar5 = DynamicTypeHandler::SetItem
                      (&local_40->super_DynamicTypeHandler,instance,local_58,value,
                       PropertyOperation_None);
    return BVar5;
  }
  if ((*(char *)((long)&pTVar1[1].javascriptLibrary.ptr + 1) == '\x01') &&
     (((local_40->super_DynamicTypeHandler).flags & 0x10) == 0)) {
    AssertCount = AssertCount + 1;
    local_48 = info;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x327,
                                "(!instance->GetDynamicType()->GetIsShared() || GetIsShared())",
                                "!instance->GetDynamicType()->GetIsShared() || GetIsShared()");
    if (!bVar3) {
LAB_00c50604:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
    info = local_48;
  }
  if (local_32 != '\0') {
    iVar4 = (*(local_40->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])();
    instanceAttributes = (ObjectSlotAttributes *)CONCAT44(extraout_var,iVar4);
    if ((instanceAttributes != (ObjectSlotAttributes *)0x0) &&
       ((instanceAttributes[index] & ObjectSlotAttr_Accessor) != ObjectSlotAttr_None)) {
      BVar5 = SetAttributesHelper(local_40,instance,propertyId,index,instanceAttributes,
                                  instanceAttributes[index] & ~ObjectSlotAttr_Accessor,true);
      if (BVar5 != 0) {
        if (info != (PropertyValueInfo *)0x0) {
          info->m_instance = &instance->super_RecyclableObject;
          info->m_propertyIndex = 0xffff;
          info->m_attributes = '\0';
          info->flags = InlineCacheNoFlags;
        }
        FromTypeHandler(*(DynamicTypeHandler **)((instance->super_RecyclableObject).type.ptr + 1));
        DynamicTypeHandler::SetSlotUnchecked(instance,(uint)index,value);
        return 1;
      }
      pDVar7 = DynamicObject::GetTypeHandler(instance);
      iVar4 = (*pDVar7->_vptr_DynamicTypeHandler[0x16])
                        (pDVar7,instance,(ulong)(uint)propertyId,value,_indexVal,info);
      return iVar4;
    }
  }
  this_00 = FromTypeHandler(*(DynamicTypeHandler **)
                             ((instance->super_RecyclableObject).type.ptr + 1));
  SetSlotAndCache(this_00,instance,propertyId,(PropertyRecord *)0x0,index,value,info,
                  (PropertyOperationFlags)_indexVal,local_31);
  return 1;
}

Assistant:

BOOL PathTypeHandlerBase::SetPropertyInternal(DynamicObject* instance, PropertyId propertyId, PropertyIndex index, Var value, ObjectSlotAttributes attr, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects, bool isInit)
    {
        PathTypeHandlerBase *newTypeHandler = nullptr;

        // Path type handler doesn't support pre-initialization (PropertyOperation_PreInit). Pre-initialized properties
        // will get marked as fixed when pre-initialized and then as non-fixed when their actual values are set.

        Assert(value != nullptr || IsInternalPropertyId(propertyId));

        JavascriptLibrary::CheckAndInvalidateIsConcatSpreadableCache(propertyId, instance->GetScriptContext());

        if (index != Constants::NoSlot)
        {
            // If type is shared then the handler must be shared as well.  This is a weaker invariant than in AddPropertyInternal,
            // because the type coming in here may be the result of DynamicObject::ChangeType(). In that case the handler may have
            // already been shared, but the newly created type isn't - and likely never will be - shared (is typically unreachable).
            // In CacheOperators::CachePropertyWrite we ensure that we never cache property adds for types that aren't shared.
            Assert(!instance->GetDynamicType()->GetIsShared() || GetIsShared());

            bool setAttrDone;
            if (setAttributes)
            {
                setAttrDone = this->SetAttributesHelper(instance, propertyId, index, GetAttributeArray(), attr, true);
                if (!setAttrDone)
                {
                    return instance->GetTypeHandler()->SetPropertyWithAttributes(instance, propertyId, value, attr, info, flags, possibleSideEffects);
                }
            }
            else if (isInit)
            {
                ObjectSlotAttributes * attributes = this->GetAttributeArray();
                if (attributes && (attributes[index] & ObjectSlotAttr_Accessor))
                {
                    setAttrDone = this->SetAttributesHelper(instance, propertyId, index, attributes, (ObjectSlotAttributes)(attributes[index] & ~ObjectSlotAttr_Accessor), true);
                    if (!setAttrDone)
                    {
                        return instance->GetTypeHandler()->InitProperty(instance, propertyId, value, flags, info);
                    }
                    // We're changing an accessor into a data property at object init time. Don't cache this transition from setter to non-setter,
                    // as it behaves differently from a normal set property.
                    PropertyValueInfo::SetNoCache(info, instance);
                    newTypeHandler = PathTypeHandlerBase::FromTypeHandler(instance->GetDynamicType()->GetTypeHandler());
                    newTypeHandler->SetSlotUnchecked(instance, index, value);
                    return true;
                }
            }
            newTypeHandler = PathTypeHandlerBase::FromTypeHandler(instance->GetDynamicType()->GetTypeHandler());
            newTypeHandler->SetSlotAndCache(instance, propertyId, nullptr, index, value, info, flags, possibleSideEffects);
            return true;
        }

        // Always check numeric propertyId. This may create an objectArray.
        ScriptContext* scriptContext = instance->GetScriptContext();
        uint32 indexVal;
        if (scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            if (setAttributes)
            {
                if (attr != ObjectSlotAttr_Default)
                {
                    return this->ConvertToTypeWithItemAttributes(instance)->SetItemWithAttributes(instance, indexVal, value, ObjectSlotAttributesToPropertyAttributes(attr));
                }
            }
            return PathTypeHandlerBase::SetItem(instance, indexVal, value, PropertyOperation_None);
        }

        return PathTypeHandlerBase::AddPropertyInternal(instance, propertyId, value, attr, info, flags, possibleSideEffects);
    }